

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_char(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef local_6c;
  TRef tr_1;
  TRef hdr;
  TRef tr;
  BCReg i;
  TRef k255;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  TVar1 = lj_ir_kint(J,0xff);
  for (hdr = 0; J->base[hdr] != 0; hdr = hdr + 1) {
    TVar2 = lj_opt_narrow_toint(J,J->base[hdr]);
    (J->fold).ins.field_0.ot = 0x693;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x5d04;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = 2;
    TVar2 = lj_opt_fold(J);
    J->base[hdr] = TVar2;
  }
  if (hdr < 2) {
    if (hdr == 0) {
      TVar1 = lj_ir_kgc(J,(GCobj *)&J[-1].penalty[0x2a].val,IRT_STR);
      *J->base = TVar1;
    }
  }
  else {
    TVar1 = recff_bufhdr(J);
    local_6c = TVar1;
    for (hdr = 0; J->base[hdr] != 0; hdr = hdr + 1) {
      TVar2 = J->base[hdr];
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      local_6c = lj_opt_fold(J);
    }
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J);
    *J->base = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_char(jit_State *J, RecordFFData *rd)
{
  TRef k255 = lj_ir_kint(J, 255);
  BCReg i;
  for (i = 0; J->base[i] != 0; i++) {  /* Convert char values to strings. */
    TRef tr = lj_opt_narrow_toint(J, J->base[i]);
    emitir(IRTGI(IR_ULE), tr, k255);
    J->base[i] = emitir(IRT(IR_TOSTR, IRT_STR), tr, IRTOSTR_CHAR);
  }
  if (i > 1) {  /* Concatenate the strings, if there's more than one. */
    TRef hdr = recff_bufhdr(J), tr = hdr;
    for (i = 0; J->base[i] != 0; i++)
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, J->base[i]);
    J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
  } else if (i == 0) {
    J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
  }
  UNUSED(rd);
}